

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_flush_container_mt(cram_fd *fd,cram_container *c)

{
  undefined8 *arg;
  cram_job *j;
  cram_container *c_local;
  cram_fd *fd_local;
  
  if (fd->pool == (t_pool *)0x0) {
    fd_local._4_4_ = cram_flush_container(fd,c);
  }
  else {
    arg = (undefined8 *)malloc(0x10);
    if (arg == (undefined8 *)0x0) {
      fd_local._4_4_ = -1;
    }
    else {
      *arg = fd;
      arg[1] = c;
      t_pool_dispatch(fd->pool,fd->rqueue,cram_flush_thread,arg);
      fd_local._4_4_ = cram_flush_result(fd);
    }
  }
  return fd_local._4_4_;
}

Assistant:

int cram_flush_container_mt(cram_fd *fd, cram_container *c) {
    cram_job *j;

    if (!fd->pool)
	return cram_flush_container(fd, c);

    if (!(j = malloc(sizeof(*j))))
	return -1;
    j->fd = fd;
    j->c = c;
    
    t_pool_dispatch(fd->pool, fd->rqueue, cram_flush_thread, j);

    return cram_flush_result(fd);
}